

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::crate::CrateReader::ReadVariantSelectionMap(CrateReader *this,VariantSelectionMap *d)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_250 [8];
  string value;
  undefined1 local_228 [8];
  string key;
  size_t i;
  __cxx11 local_1e0 [32];
  __cxx11 local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream ss_e;
  ulong local_28;
  uint64_t sz;
  VariantSelectionMap *d_local;
  CrateReader *this_local;
  
  if (d == (VariantSelectionMap *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    sz = (uint64_t)d;
    d_local = (VariantSelectionMap *)this;
    bVar1 = StreamReader::read8(this->_sr,&local_28);
    if (bVar1) {
      if ((this->_config).maxVariantsMapElements < local_28) {
        ::std::__cxx11::ostringstream::ostringstream(local_1a0);
        poVar2 = ::std::operator<<((ostream *)local_1a0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,"[Crate]");
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ReadVariantSelectionMap");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x6be);
        ::std::operator<<(poVar2," ");
        poVar2 = ::std::operator<<((ostream *)local_1a0,
                                   "The number of elements for VariantsMap data is too large. Max = "
                                  );
        std::__cxx11::to_string(local_1c0,(this->_config).maxVariantsMapElements);
        poVar2 = ::std::operator<<(poVar2,(string *)local_1c0);
        poVar2 = ::std::operator<<(poVar2,", but got ");
        std::__cxx11::to_string(local_1e0,local_28);
        poVar2 = ::std::operator<<(poVar2,(string *)local_1e0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)local_1e0);
        ::std::__cxx11::string::~string((string *)local_1c0);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&i);
        ::std::__cxx11::string::~string((string *)&i);
        this_local._7_1_ = 0;
        ::std::__cxx11::ostringstream::~ostringstream(local_1a0);
      }
      else {
        for (key.field_2._8_8_ = 0; (ulong)key.field_2._8_8_ < local_28;
            key.field_2._8_8_ = key.field_2._8_8_ + 1) {
          ::std::__cxx11::string::string((string *)local_228);
          bVar1 = ReadString(this,(string *)local_228);
          if (bVar1) {
            ::std::__cxx11::string::string((string *)local_250);
            bVar1 = ReadString(this,(string *)local_250);
            if (bVar1) {
              ::std::
              map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              ::emplace<std::__cxx11::string&,std::__cxx11::string&>
                        ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                          *)sz,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_228,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_250);
            }
            else {
              this_local._7_1_ = 0;
            }
            value.field_2._13_3_ = 0;
            value.field_2._M_local_buf[0xc] = !bVar1;
            ::std::__cxx11::string::~string((string *)local_250);
          }
          else {
            this_local._7_1_ = 0;
            value.field_2._12_4_ = 1;
          }
          ::std::__cxx11::string::~string((string *)local_228);
          if (value.field_2._12_4_ != 0) goto LAB_00231390;
        }
        this_local._7_1_ = 1;
      }
    }
    else {
      ::std::__cxx11::string::operator+=
                ((string *)&this->_err,
                 "Failed to read the number of elements for VariantsMap data.\n");
      this_local._7_1_ = 0;
    }
  }
LAB_00231390:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CrateReader::ReadVariantSelectionMap(VariantSelectionMap *d) {

  if (!d) {
    return false;
  }

  // map<string, string>

  // n
  // [key, value] * n

  uint64_t sz;
  if (!_sr->read8(&sz)) {
    _err += "Failed to read the number of elements for VariantsMap data.\n";
    return false;
  }

  if (sz > _config.maxVariantsMapElements) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "The number of elements for VariantsMap data is too large. Max = " << std::to_string(_config.maxVariantsMapElements) << ", but got " << std::to_string(sz));
  }

  for (size_t i = 0; i < sz; i++) {
    std::string key;
    if (!ReadString(&key)) {
      return false;
    }

    std::string value;
    if (!ReadString(&value)) {
      return false;
    }

    // TODO: Duplicate key check?
    d->emplace(key, value);
  }

  return true;
}